

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O3

GLuint deqp::gls::TextureSamplerTest::createTexture(Functions *gl,GLenum target)

{
  GLenum GVar1;
  GLuint GVar2;
  GLuint GStack_9c;
  Vec4 VStack_98;
  Texture3D TStack_80;
  Vec4 VStack_28;
  
  if (target == 0x8513) {
    createTextureCube(gl);
  }
  else {
    if (target == 0x806f) {
      GStack_9c = 0xffffffff;
      VStack_98.m_data[0] = 1.12104e-44;
      VStack_98.m_data[1] = 4.2039e-45;
      tcu::Texture3D::Texture3D(&TStack_80,(TextureFormat *)&VStack_98,0x20,0x20,0x20);
      tcu::Texture3D::allocLevel(&TStack_80,0);
      VStack_98.m_data[0] = 0.0;
      VStack_98.m_data[1] = 0.0;
      VStack_98.m_data[2] = 0.0;
      VStack_98.m_data[3] = 0.0;
      VStack_28.m_data[0] = 1.0;
      VStack_28.m_data[1] = 1.0;
      VStack_28.m_data[2] = 1.0;
      VStack_28.m_data[3] = 1.0;
      tcu::fillWithComponentGradients
                (TStack_80.super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start,&VStack_98,&VStack_28);
      (*gl->genTextures)(1,&GStack_9c);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"glGenTextures(1, &texture)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x19e);
      (*gl->bindTexture)(0x806f,GStack_9c);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"glBindTexture(GL_TEXTURE_3D, texture)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x1a1);
      (*gl->texImage3D)(0x806f,0,0x8058,TStack_80.m_width,TStack_80.m_height,TStack_80.m_depth,0,
                        0x1908,0x1401,
                        ((TStack_80.super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_data);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,
                      "glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), refTexture.getDepth(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x1a4);
      (*gl->generateMipmap)(0x806f);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"glGenerateMipmap(GL_TEXTURE_3D)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x1a7);
      (*gl->bindTexture)(0x806f,0);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"glBindTexture(GL_TEXTURE_3D, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                      ,0x1aa);
      GVar2 = GStack_9c;
      tcu::Texture3D::~Texture3D(&TStack_80);
      return GVar2;
    }
    if (target == 0xde1) {
      GVar2 = createTexture2D(gl);
      return GVar2;
    }
  }
  return 0xffffffff;
}

Assistant:

GLuint TextureSamplerTest::createTexture (const glw::Functions& gl, GLenum target)
{
	switch (target)
	{
		case GL_TEXTURE_2D:
			return createTexture2D(gl);

		case GL_TEXTURE_3D:
			return createTexture3D(gl);

		case GL_TEXTURE_CUBE_MAP:
			return createTextureCube(gl);

		default:
			DE_ASSERT(false);
			return (GLuint)-1;
	}
}